

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  cmInstallTargetGenerator *pcVar1;
  cmInstallTargetGenerator *pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  char *pcVar6;
  cmComputeLinkInformation *this_02;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  _Alloc_hider _Var11;
  Indent IVar12;
  string new_id;
  string fname;
  string for_install;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  string installNameTool;
  string local_118;
  string *local_f8;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  _Rb_tree_node_base *local_90;
  size_t local_88;
  string *local_80;
  cmInstallTargetGenerator *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  if ((this->ImportLibrary == false) &&
     (((local_f8 = config, local_80 = toDestDirPath,
       TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == SHARED_LIBRARY ||
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == MODULE_LIBRARY)) ||
      (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == EXECUTABLE)))) {
    this_00 = this->Target->Target->Makefile;
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CMAKE_INSTALL_NAME_TOOL","")
    ;
    pcVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)local_b0);
    std::__cxx11::string::string((string *)&local_70,pcVar6,(allocator *)&local_118);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if (local_68 != 0) {
      local_b0._24_8_ = local_b0 + 8;
      local_b0._8_4_ = _S_red;
      local_b0._16_8_ = 0;
      local_88 = 0;
      local_90 = (_Rb_tree_node_base *)local_b0._24_8_;
      this_02 = cmGeneratorTarget::GetLinkInformation(this->Target,local_f8);
      pcVar1 = local_78;
      if (this_02 != (cmComputeLinkInformation *)0x0) {
        psVar7 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_02);
        p_Var9 = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        pcVar2 = this;
        pcVar1 = local_78;
        while (local_78 = pcVar2,
              (_Rb_tree_header *)p_Var9 != &(psVar7->_M_t)._M_impl.super__Rb_tree_header) {
          this_01 = *(cmGeneratorTarget **)(p_Var9 + 1);
          bVar3 = cmGeneratorTarget::IsImported(this_01);
          if (!bVar3) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_118,this_01,local_f8);
            cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_d0,this_01);
            _Var11._M_p = local_d0._M_dataplus._M_p;
            if ((local_118._M_string_length != local_d0._M_string_length) ||
               ((local_118._M_string_length != 0 &&
                (iVar5 = bcmp(local_118._M_dataplus._M_p,local_d0._M_dataplus._M_p,
                              local_118._M_string_length), iVar5 != 0)))) {
              GetInstallFilename(&local_f0,this_01,local_f8,NameSO);
              std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f0._M_dataplus._M_p);
              std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_b0,&local_118);
              std::__cxx11::string::_M_assign((string *)pmVar8);
              _Var11._M_p = local_d0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
                _Var11._M_p = local_d0._M_dataplus._M_p;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var11._M_p != &local_d0.field_2) {
              operator_delete(_Var11._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            this = local_78;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                       local_118.field_2._M_local_buf[0]) + 1);
              this = local_78;
            }
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          pcVar2 = local_78;
          pcVar1 = local_78;
        }
      }
      local_78 = pcVar1;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      TVar4 = cmGeneratorTarget::GetType(this->Target);
      if (TVar4 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_d0,this->Target,local_f8);
        cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_f0,this->Target);
        cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        _Var11._M_p = local_f0._M_dataplus._M_p;
        if ((local_d0._M_string_length != local_f0._M_string_length) ||
           ((local_d0._M_string_length != 0 &&
            (iVar5 = bcmp(local_d0._M_dataplus._M_p,local_f0._M_dataplus._M_p,
                          local_d0._M_string_length), iVar5 != 0)))) {
          std::__cxx11::string::_M_assign((string *)&local_118);
          GetInstallFilename(&local_50,this->Target,local_f8,NameSO);
          std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_50._M_dataplus._M_p);
          _Var11._M_p = local_f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            _Var11._M_p = local_f0._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var11._M_p != &local_f0.field_2) {
          operator_delete(_Var11._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_88 != 0 || local_118._M_string_length != 0) {
        IVar12.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar12.Level = IVar12.Level + -1;
          } while (IVar12.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        if (local_118._M_string_length != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          IVar12.Level = indent.Level;
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              IVar12.Level = IVar12.Level + -1;
            } while (IVar12.Level != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"  -id \"",7);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (os,local_118._M_dataplus._M_p,local_118._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
        }
        p_Var9 = (_Rb_tree_node_base *)local_b0._24_8_;
        if ((_Rb_tree_node_base *)local_b0._24_8_ != (_Rb_tree_node_base *)(local_b0 + 8)) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            IVar12.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar12.Level = IVar12.Level + -1;
              } while (IVar12.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"  -change \"",0xb);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (os,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"",3);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,*(char **)(p_Var9 + 2),(long)p_Var9[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != (_Rb_tree_node_base *)(local_b0 + 8));
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,(local_80->_M_dataplus)._M_p,local_80->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b0);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (std::set<cmGeneratorTarget const*>::const_iterator j =
           sharedLibs.begin();
         j != sharedLibs.end(); ++j) {
      cmGeneratorTarget const* tgt = *j;

      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree();
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree();

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = for_install;
      new_id += this->GetInstallFilename(this->Target, config, NameSO);
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (std::map<std::string, std::string>::const_iterator i =
           install_name_remap.begin();
         i != install_name_remap.end(); ++i) {
      os << "\n"
         << indent << "  -change \"" << i->first << "\" \"" << i->second
         << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}